

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall
vkb::PhysicalDevice::enable_features_node_if_present
          (PhysicalDevice *this,GenericFeaturesPNextNode *node)

{
  reference this_00;
  VulkanFunctions *pVVar1;
  bool bVar2;
  bool local_149;
  undefined1 local_148 [6];
  bool instance_is_1_1;
  bool required_features_supported;
  GenericFeatureChain fill_chain;
  undefined1 local_120 [8];
  GenericFeatureChain requested_features;
  VkPhysicalDeviceFeatures2 actual_pdf2;
  GenericFeaturesPNextNode *node_local;
  PhysicalDevice *this_local;
  
  requested_features.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detail::GenericFeatureChain::GenericFeatureChain((GenericFeatureChain *)local_120);
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::push_back((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               *)local_120,node);
  detail::GenericFeatureChain::GenericFeatureChain
            ((GenericFeatureChain *)local_148,(GenericFeatureChain *)local_120);
  this_00 = std::
            vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ::front((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                     *)local_148);
  detail::GenericFeaturesPNextNode::disable_fields(this_00);
  requested_features.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(requested_features.nodes.
                         super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x3b9bb078);
  detail::GenericFeatureChain::chain_up
            ((GenericFeatureChain *)local_148,
             (VkPhysicalDeviceFeatures2 *)
             &requested_features.nodes.
              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_149 = false;
  bVar2 = 0x400fff < this->instance_version;
  if ((bVar2) || ((this->properties2_ext_enabled & 1U) != 0)) {
    if (bVar2) {
      pVVar1 = detail::vulkan_functions();
      (*pVVar1->fp_vkGetPhysicalDeviceFeatures2)
                (this->physical_device,
                 (VkPhysicalDeviceFeatures2 *)
                 &requested_features.nodes.
                  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      pVVar1 = detail::vulkan_functions();
      (*pVVar1->fp_vkGetPhysicalDeviceFeatures2KHR)
                (this->physical_device,
                 (VkPhysicalDeviceFeatures2 *)
                 &requested_features.nodes.
                  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_149 = detail::GenericFeatureChain::match_all
                          ((GenericFeatureChain *)local_148,(GenericFeatureChain *)local_120);
    if (local_149) {
      detail::GenericFeatureChain::combine
                (&this->extended_features_chain,(GenericFeatureChain *)local_120);
    }
  }
  detail::GenericFeatureChain::~GenericFeatureChain((GenericFeatureChain *)local_148);
  detail::GenericFeatureChain::~GenericFeatureChain((GenericFeatureChain *)local_120);
  return local_149;
}

Assistant:

bool PhysicalDevice::enable_features_node_if_present(detail::GenericFeaturesPNextNode const& node) {
    VkPhysicalDeviceFeatures2 actual_pdf2{};

    detail::GenericFeatureChain requested_features;
    requested_features.nodes.push_back(node);

    detail::GenericFeatureChain fill_chain = requested_features;
    // Zero out supported features
    fill_chain.nodes.front().disable_fields();

    actual_pdf2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    fill_chain.chain_up(actual_pdf2);

    bool required_features_supported = false;
    bool instance_is_1_1 = instance_version >= VKB_VK_API_VERSION_1_1;
    if (instance_is_1_1 || properties2_ext_enabled) {
        if (instance_is_1_1) {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2(physical_device, &actual_pdf2);
        } else {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2KHR(physical_device, &actual_pdf2);
        }
        required_features_supported = fill_chain.match_all(requested_features);
        if (required_features_supported) {
            extended_features_chain.combine(requested_features);
        }
    }
    return required_features_supported;
}